

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O3

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  ushort uVar2;
  ushort uVar3;
  stbrp_node *psVar4;
  undefined1 auVar5 [16];
  stbrp_context *psVar6;
  uint uVar7;
  int iVar8;
  int extraout_EAX;
  long extraout_RAX;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  stbrp_node *psVar12;
  stbrp_node **ppsVar13;
  stbrp_context *psVar14;
  stbrp_context *psVar15;
  char *in_R8;
  stbrp_node *psVar16;
  stbrp_node **ppsVar17;
  int iVar18;
  uint uVar19;
  size_t sVar20;
  uint uVar21;
  ulong __nmemb;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int waste;
  uint local_8c;
  uint local_88;
  int local_84;
  stbrp_node **local_80;
  int local_70;
  int local_6c;
  stbrp_rect *local_68;
  stbrp_context *local_60;
  ulong local_58;
  stbrp_node **local_50;
  ulong local_48;
  stbrp_rect *local_40;
  ulong local_38;
  
  auVar5 = _DAT_00246490;
  __nmemb = (ulong)(uint)num_rects;
  if (num_rects < 1) {
    __nmemb = (ulong)num_rects;
    qsort(rects,__nmemb,0x10,rect_height_compare);
  }
  else {
    lVar9 = __nmemb - 1;
    auVar22._8_4_ = (int)lVar9;
    auVar22._0_8_ = lVar9;
    auVar22._12_4_ = (int)((ulong)lVar9 >> 0x20);
    piVar10 = &rects[1].was_packed;
    uVar11 = 0;
    auVar22 = auVar22 ^ _DAT_00246490;
    auVar23 = _DAT_00246480;
    do {
      auVar24 = auVar23 ^ auVar5;
      if ((bool)(~(auVar24._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar24._0_4_ ||
                  auVar22._4_4_ < auVar24._4_4_) & 1)) {
        piVar10[-4] = (int)uVar11;
      }
      if ((auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_) &&
          auVar24._12_4_ <= auVar22._12_4_) {
        *piVar10 = (int)uVar11 + 1;
      }
      uVar11 = uVar11 + 2;
      lVar9 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 2;
      auVar23._8_8_ = lVar9 + 2;
      piVar10 = piVar10 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar11);
    qsort(rects,__nmemb,0x10,rect_height_compare);
    if (0 < num_rects) {
      local_50 = &context->active_head;
      sVar20 = 0;
      local_60 = context;
      local_58 = __nmemb;
      local_48 = __nmemb;
      local_40 = rects;
      do {
        psVar1 = rects + sVar20;
        uVar2 = rects[sVar20].w;
        if ((uVar2 == 0) || (uVar3 = psVar1->h, uVar3 == 0)) {
          psVar1->x = 0;
          psVar1->y = 0;
        }
        else {
          iVar8 = context->align;
          iVar18 = (uint)uVar2 + iVar8 + -1;
          uVar19 = iVar18 - iVar18 % iVar8;
          local_68 = psVar1;
          local_38 = (ulong)uVar2;
          if ((int)uVar19 % iVar8 != 0) {
            in_R8 = "width % c->align == 0";
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                        ,0x168,"stbrp__skyline_find_best_pos","ImGui ASSERT FAILED: %s");
          }
          ppsVar17 = local_50;
          if (((int)uVar19 <= context->width) && ((int)(uint)uVar3 <= context->height)) {
            uVar2 = (ushort)((stbrp_context *)*local_50)->width;
            if (context->width < (int)(uVar2 + uVar19)) {
              iVar8 = context->heuristic;
              local_8c = 0x40000000;
              local_84 = 0x40000000;
LAB_001ce8b1:
              local_80 = (stbrp_node **)0x0;
              local_88 = 0;
            }
            else {
              local_8c = 0x40000000;
              local_80 = (stbrp_node **)0x0;
              local_84 = 0x40000000;
              ppsVar13 = local_50;
              psVar15 = (stbrp_context *)*local_50;
              do {
                uVar21 = stbrp__skyline_find_min_y
                                   (psVar15,(stbrp_node *)(ulong)uVar2,uVar19,(int)&local_6c,
                                    (int *)in_R8);
                iVar8 = context->heuristic;
                if (iVar8 == 0) {
                  if ((int)uVar21 < (int)local_8c) {
                    local_8c = uVar21;
                    local_80 = ppsVar13;
                  }
                }
                else if (((int)(uVar3 + uVar21) <= context->height) &&
                        (((int)uVar21 < (int)local_8c || (local_6c < local_84 && uVar21 == local_8c)
                         ))) {
                  local_84 = local_6c;
                  local_8c = uVar21;
                  local_80 = ppsVar13;
                }
                ppsVar13 = (stbrp_node **)&psVar15->align;
                uVar2 = (ushort)(*(stbrp_context **)&psVar15->align)->width;
                psVar15 = *(stbrp_context **)&psVar15->align;
              } while ((int)(uVar2 + uVar19) <= context->width);
              if (local_80 == (stbrp_node **)0x0) goto LAB_001ce8b1;
              local_88 = (uint)(*local_80)->x;
            }
            if (iVar8 == 1) {
              psVar15 = (stbrp_context *)*ppsVar17;
              psVar14 = psVar15;
              if ((int)(uint)(ushort)psVar15->width < (int)uVar19) {
                do {
                  psVar14 = *(stbrp_context **)&psVar14->align;
                } while ((ushort)psVar14->width < uVar19);
              }
              do {
                uVar21 = (ushort)psVar14->width - uVar19;
                ppsVar13 = ppsVar17;
                psVar6 = psVar15;
                if ((int)uVar21 < 0) {
                  in_R8 = "xpos >= 0";
                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                              ,0x1a8,"stbrp__skyline_find_best_pos","ImGui ASSERT FAILED: %s");
                }
                do {
                  psVar15 = psVar6;
                  ppsVar17 = ppsVar13;
                  ppsVar13 = (stbrp_node **)&psVar15->align;
                  psVar6 = *(stbrp_context **)&psVar15->align;
                } while ((int)(uint)(ushort)(*(stbrp_context **)&psVar15->align)->width <=
                         (int)uVar21);
                if ((int)uVar21 < (int)(uint)(ushort)psVar15->width) {
                  in_R8 = "node->next->x > xpos && node->x <= xpos";
                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                              ,0x1ae,"stbrp__skyline_find_best_pos","ImGui ASSERT FAILED: %s");
                }
                uVar7 = stbrp__skyline_find_min_y
                                  (psVar15,(stbrp_node *)(ulong)uVar21,uVar19,(int)&local_70,
                                   (int *)in_R8);
                if ((((int)(uVar3 + uVar7) <= local_60->height) && ((int)uVar7 <= (int)local_8c)) &&
                   (((uVar7 < local_8c || (local_70 < local_84)) ||
                    ((local_70 == local_84 && ((int)uVar21 < (int)local_88)))))) {
                  local_84 = local_70;
                  local_8c = uVar7;
                  local_88 = uVar21;
                  local_80 = ppsVar17;
                }
                piVar10 = &psVar14->align;
                psVar14 = *(stbrp_context **)piVar10;
              } while (*(stbrp_context **)piVar10 != (stbrp_context *)0x0);
            }
            rects = local_40;
            context = local_60;
            __nmemb = local_48;
            if (((local_80 != (stbrp_node **)0x0) &&
                (iVar8 = uVar3 + local_8c, iVar8 <= local_60->height)) &&
               (psVar4 = local_60->free_head, psVar4 != (stbrp_node *)0x0)) {
              psVar4->x = (stbrp_coord)local_88;
              psVar4->y = (stbrp_coord)iVar8;
              local_60->free_head = psVar4->next;
              psVar16 = *local_80;
              psVar12 = psVar16;
              if ((int)(uint)psVar16->x < (int)local_88) {
                psVar12 = psVar16->next;
                local_80 = &psVar16->next;
              }
              *local_80 = psVar4;
              in_R8 = (char *)psVar12->next;
              iVar8 = local_88 + (int)local_38;
              if ((stbrp_node *)in_R8 != (stbrp_node *)0x0) {
                do {
                  psVar16 = (stbrp_node *)in_R8;
                  in_R8 = (char *)(ulong)psVar16->x;
                  if (iVar8 < (int)(uint)psVar16->x) goto LAB_001cea8f;
                  psVar12->next = local_60->free_head;
                  local_60->free_head = psVar12;
                  psVar12 = psVar16;
                  in_R8 = (char *)psVar16->next;
                } while (psVar16->next != (stbrp_node *)0x0);
                in_R8 = (char *)0x0;
              }
LAB_001cea8f:
              psVar4->next = psVar12;
              if ((int)(uint)psVar12->x < iVar8) {
                psVar12->x = (stbrp_coord)iVar8;
              }
              local_68->x = (stbrp_coord)local_88;
              local_68->y = (stbrp_coord)local_8c;
              goto LAB_001cea7e;
            }
          }
          local_68->x = 0xffff;
          local_68->y = 0xffff;
        }
LAB_001cea7e:
        sVar20 = sVar20 + 1;
        if (sVar20 == __nmemb) {
          qsort(rects,__nmemb,0x10,rect_original_order);
          lVar9 = extraout_RAX;
          if (0 < (int)local_58) {
            lVar9 = 0;
            do {
              uVar19 = 1;
              if (*(short *)((long)&rects->x + lVar9) == -1) {
                uVar19 = (uint)(*(short *)((long)&rects->y + lVar9) != -1);
              }
              *(uint *)((long)&rects->was_packed + lVar9) = uVar19;
              lVar9 = lVar9 + 0x10;
            } while (__nmemb * 0x10 != lVar9);
          }
          return (int)lVar9;
        }
      } while( true );
    }
  }
  qsort(rects,__nmemb,0x10,rect_original_order);
  return extraout_EAX;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}